

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duckdb_functions.cpp
# Opt level: O3

bool duckdb::
     ExtractFunctionData<duckdb::AggregateFunctionCatalogEntry,duckdb::AggregateFunctionExtractor>
               (FunctionEntry *entry,idx_t function_idx,DataChunk *output,idx_t output_offset)

{
  pointer pcVar1;
  SchemaCatalogEntry *pSVar2;
  size_t __n;
  pointer pAVar3;
  pointer pAVar4;
  bool bVar5;
  bool bVar6;
  DataChunk *pDVar7;
  AggregateFunctionCatalogEntry *pAVar8;
  idx_t offset;
  size_type sVar9;
  char cVar10;
  int iVar11;
  idx_t iVar12;
  reference pvVar13;
  string *psVar14;
  long lVar15;
  vector<duckdb::Value,_true> *pvVar16;
  reference __args;
  long *plVar17;
  ulong uVar18;
  size_type *psVar19;
  ulong __val;
  char cVar20;
  string __str;
  AggregateFunctionCatalogEntry *function;
  optional_idx description_idx;
  vector<duckdb::LogicalType,_true> parameter_types_vector;
  Value parameter_types_value;
  Value VStack_2c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_288;
  DataChunk *local_268;
  idx_t local_260;
  undefined1 local_258 [32];
  vector<duckdb::Value,_std::allocator<duckdb::Value>_> local_238;
  AggregateFunctionCatalogEntry *local_220;
  idx_t local_218;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_210;
  undefined1 local_208 [24];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  vStack_1f0;
  _Alloc_hider local_1d8;
  size_type sStack_1d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1c8;
  pointer local_1b8;
  pointer pbStack_1b0;
  pointer local_1a8;
  pointer pbStack_1a0;
  pointer local_198;
  pointer pbStack_190;
  string local_188;
  string local_168;
  vector<duckdb::Value,_true> local_148;
  vector<duckdb::Value,_true> local_130;
  LogicalType local_118;
  LogicalType local_100;
  vector<duckdb::LogicalType,_true> local_e8;
  string local_d0;
  string local_b0;
  string local_90;
  Value local_70;
  
  AggregateFunctionExtractor::GetParameterLogicalTypes
            (&local_e8,(AggregateFunctionCatalogEntry *)entry,function_idx);
  AggregateFunctionExtractor::GetParameterTypes
            (&local_70,(AggregateFunctionCatalogEntry *)entry,function_idx);
  local_210._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
       GetFunctionDescriptionIndex(&entry->descriptions,&local_e8);
  if (local_210._M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0xffffffffffffffff) {
    sStack_1d0 = 0;
    local_1c8._8_8_ = 0;
    vStack_1f0.
    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    vStack_1f0.
    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_208._16_8_ = (pointer)0x0;
    vStack_1f0.
    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_208._0_8_ = (pointer)0x0;
    local_208._8_8_ = (pointer)0x0;
    local_1c8._M_allocated_capacity = 0;
    local_1b8 = (pointer)0x0;
    pbStack_1b0 = (pointer)0x0;
    local_1a8 = (pointer)0x0;
    pbStack_1a0 = (pointer)0x0;
    local_198 = (pointer)0x0;
    pbStack_190 = (pointer)0x0;
    local_1d8._M_p = (pointer)&local_1c8;
  }
  else {
    iVar12 = optional_idx::GetIndex((optional_idx *)&local_210);
    pvVar13 = vector<duckdb::FunctionDescription,_true>::operator[](&entry->descriptions,iVar12);
    FunctionDescription::FunctionDescription((FunctionDescription *)local_208,pvVar13);
  }
  psVar14 = Catalog::GetName_abi_cxx11_
                      ((((entry->super_StandardEntry).schema)->super_InCatalogEntry).catalog);
  pcVar1 = (psVar14->_M_dataplus)._M_p;
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_90,pcVar1,pcVar1 + psVar14->_M_string_length);
  Value::Value(&VStack_2c8,&local_90);
  DataChunk::SetValue(output,0,output_offset,&VStack_2c8);
  Value::~Value(&VStack_2c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  iVar12 = Catalog::GetOid((((entry->super_StandardEntry).schema)->super_InCatalogEntry).catalog);
  lVar15 = NumericCastImpl<long,_unsigned_long,_false>::Convert(iVar12);
  Value::BIGINT(&VStack_2c8,lVar15);
  DataChunk::SetValue(output,1,output_offset,&VStack_2c8);
  Value::~Value(&VStack_2c8);
  pSVar2 = (entry->super_StandardEntry).schema;
  pcVar1 = (pSVar2->super_InCatalogEntry).super_CatalogEntry.name._M_dataplus._M_p;
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_b0,pcVar1,
             pcVar1 + (pSVar2->super_InCatalogEntry).super_CatalogEntry.name._M_string_length);
  Value::Value(&VStack_2c8,&local_b0);
  DataChunk::SetValue(output,2,output_offset,&VStack_2c8);
  Value::~Value(&VStack_2c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p);
  }
  pcVar1 = (entry->super_StandardEntry).super_InCatalogEntry.super_CatalogEntry.name._M_dataplus.
           _M_p;
  local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_d0,pcVar1,
             pcVar1 + (entry->super_StandardEntry).super_InCatalogEntry.super_CatalogEntry.name.
                      _M_string_length);
  Value::Value(&VStack_2c8,&local_d0);
  DataChunk::SetValue(output,3,output_offset,&VStack_2c8);
  Value::~Value(&VStack_2c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p);
  }
  __n = (entry->alias_of)._M_string_length;
  local_268 = output;
  local_260 = output_offset;
  local_220 = (AggregateFunctionCatalogEntry *)entry;
  if (__n == 0) {
LAB_015168e4:
    LogicalType::LogicalType(&local_100,SQLNULL);
    Value::Value(&VStack_2c8,&local_100);
    bVar6 = true;
    bVar5 = false;
  }
  else {
    pcVar1 = (entry->alias_of)._M_dataplus._M_p;
    if (__n == (entry->super_StandardEntry).super_InCatalogEntry.super_CatalogEntry.name.
               _M_string_length) {
      iVar11 = bcmp(pcVar1,(entry->super_StandardEntry).super_InCatalogEntry.super_CatalogEntry.name
                           ._M_dataplus._M_p,__n);
      if (iVar11 == 0) goto LAB_015168e4;
    }
    local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
    ::std::__cxx11::string::_M_construct<char*>((string *)&local_168,pcVar1,pcVar1 + __n);
    Value::Value(&VStack_2c8,&local_168);
    bVar5 = true;
    bVar6 = false;
  }
  DataChunk::SetValue(local_268,4,local_260,&VStack_2c8);
  Value::~Value(&VStack_2c8);
  if ((bVar5) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_168._M_dataplus._M_p != &local_168.field_2)) {
    operator_delete(local_168._M_dataplus._M_p);
  }
  if (bVar6) {
    LogicalType::~LogicalType(&local_100);
  }
  Value::Value(&VStack_2c8,"aggregate");
  pAVar8 = local_220;
  iVar12 = local_260;
  pDVar7 = local_268;
  DataChunk::SetValue(local_268,5,local_260,&VStack_2c8);
  Value::~Value(&VStack_2c8);
  sVar9 = sStack_1d0;
  if (sStack_1d0 == 0) {
    LogicalType::LogicalType(&local_118,SQLNULL);
    Value::Value(&VStack_2c8,&local_118);
  }
  else {
    local_188._M_dataplus._M_p = (pointer)&local_188.field_2;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_188,local_1d8._M_p,local_1d8._M_p + sStack_1d0);
    Value::Value(&VStack_2c8,&local_188);
  }
  DataChunk::SetValue(pDVar7,6,iVar12,&VStack_2c8);
  Value::~Value(&VStack_2c8);
  if (sVar9 == 0) {
    LogicalType::~LogicalType(&local_118);
  }
  else if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)local_188._M_dataplus._M_p != &local_188.field_2) {
    operator_delete(local_188._M_dataplus._M_p);
  }
  DataChunk::SetValue(pDVar7,7,iVar12,
                      &(pAVar8->super_FunctionEntry).super_StandardEntry.super_InCatalogEntry.
                       super_CatalogEntry.comment);
  Value::MAP(&VStack_2c8,
             &(pAVar8->super_FunctionEntry).super_StandardEntry.super_InCatalogEntry.
              super_CatalogEntry.tags);
  DataChunk::SetValue(pDVar7,8,iVar12,&VStack_2c8);
  Value::~Value(&VStack_2c8);
  AggregateFunctionExtractor::GetReturnType(&VStack_2c8,pAVar8,function_idx);
  DataChunk::SetValue(pDVar7,9,iVar12,&VStack_2c8);
  Value::~Value(&VStack_2c8);
  local_238.super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_238.super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_238.super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_218 = function_idx;
  if (vStack_1f0.
      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      vStack_1f0.
      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    AggregateFunctionExtractor::GetParameters
              ((vector<duckdb::Value,_true> *)local_258,pAVar8,function_idx);
    local_288.field_2._M_allocated_capacity =
         (size_type)
         local_238.super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    local_288._M_string_length =
         (size_type)
         local_238.super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
         super__Vector_impl_data._M_finish;
    local_288._M_dataplus._M_p =
         (pointer)local_238.super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>.
                  _M_impl.super__Vector_impl_data._M_start;
    local_238.super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)local_258._16_8_;
    local_238.super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)local_258._0_8_;
    local_238.super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)local_258._8_8_;
    local_258._0_8_ = (pointer)0x0;
    local_258._8_8_ = (pointer)0x0;
    local_258._16_8_ = (pointer)0x0;
    ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector
              ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_288);
    ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector
              ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)local_258);
  }
  else {
    __val = 0;
    while( true ) {
      pvVar16 = ListValue::GetChildren(&local_70);
      if ((ulong)((long)(pvVar16->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
                        super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                  (long)(pvVar16->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
                        super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
                        super__Vector_impl_data._M_start >> 6) <= __val) break;
      if (__val < (ulong)((long)vStack_1f0.
                                super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                .
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                          (long)vStack_1f0.
                                super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                .
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start >> 5)) {
        __args = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                 ::operator[](&vStack_1f0,__val);
        ::std::vector<duckdb::Value,std::allocator<duckdb::Value>>::
        emplace_back<std::__cxx11::string&>
                  ((vector<duckdb::Value,std::allocator<duckdb::Value>> *)&local_238,__args);
      }
      else {
        cVar20 = '\x01';
        if (9 < __val) {
          uVar18 = __val;
          cVar10 = '\x04';
          do {
            cVar20 = cVar10;
            if (uVar18 < 100) {
              cVar20 = cVar20 + -2;
              goto LAB_01516ba5;
            }
            if (uVar18 < 1000) {
              cVar20 = cVar20 + -1;
              goto LAB_01516ba5;
            }
            if (uVar18 < 10000) goto LAB_01516ba5;
            bVar5 = 99999 < uVar18;
            uVar18 = uVar18 / 10000;
            cVar10 = cVar20 + '\x04';
          } while (bVar5);
          cVar20 = cVar20 + '\x01';
        }
LAB_01516ba5:
        local_258._0_8_ = local_258 + 0x10;
        ::std::__cxx11::string::_M_construct((ulong)local_258,cVar20);
        ::std::__detail::__to_chars_10_impl<unsigned_long>
                  ((char *)local_258._0_8_,local_258._8_4_,__val);
        plVar17 = (long *)::std::__cxx11::string::replace((ulong)local_258,0,(char *)0x0,0x1de98d2);
        psVar19 = (size_type *)(plVar17 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar17 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar19) {
          local_288.field_2._M_allocated_capacity = *psVar19;
          local_288.field_2._8_8_ = plVar17[3];
          local_288._M_dataplus._M_p = (pointer)&local_288.field_2;
        }
        else {
          local_288.field_2._M_allocated_capacity = *psVar19;
          local_288._M_dataplus._M_p = (pointer)*plVar17;
        }
        local_288._M_string_length = plVar17[1];
        *plVar17 = (long)psVar19;
        plVar17[1] = 0;
        *(undefined1 *)(plVar17 + 2) = 0;
        ::std::vector<duckdb::Value,std::allocator<duckdb::Value>>::
        emplace_back<std::__cxx11::string>
                  ((vector<duckdb::Value,std::allocator<duckdb::Value>> *)&local_238,&local_288);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_288._M_dataplus._M_p != &local_288.field_2) {
          operator_delete(local_288._M_dataplus._M_p);
        }
        if ((pointer)local_258._0_8_ != (pointer)(local_258 + 0x10)) {
          operator_delete((void *)local_258._0_8_);
        }
      }
      __val = __val + 1;
    }
  }
  LogicalType::LogicalType((LogicalType *)&local_288,VARCHAR);
  ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::vector
            ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)local_258,&local_238);
  iVar12 = local_260;
  pDVar7 = local_268;
  Value::LIST(&VStack_2c8,(LogicalType *)&local_288,(vector<duckdb::Value,_true> *)local_258);
  offset = local_218;
  pAVar8 = local_220;
  ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector
            ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)local_258);
  LogicalType::~LogicalType((LogicalType *)&local_288);
  ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector
            ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_238);
  DataChunk::SetValue(pDVar7,10,iVar12,&VStack_2c8);
  Value::~Value(&VStack_2c8);
  DataChunk::SetValue(pDVar7,0xb,iVar12,&local_70);
  AggregateFunctionExtractor::GetVarArgs(&VStack_2c8,pAVar8,offset);
  DataChunk::SetValue(pDVar7,0xc,iVar12,&VStack_2c8);
  Value::~Value(&VStack_2c8);
  AggregateFunctionExtractor::GetMacroDefinition(&VStack_2c8,pAVar8,offset);
  DataChunk::SetValue(pDVar7,0xd,iVar12,&VStack_2c8);
  Value::~Value(&VStack_2c8);
  AggregateFunctionExtractor::IsVolatile(&VStack_2c8,pAVar8,offset);
  DataChunk::SetValue(pDVar7,0xe,iVar12,&VStack_2c8);
  Value::~Value(&VStack_2c8);
  Value::BOOLEAN(&VStack_2c8,
                 (pAVar8->super_FunctionEntry).super_StandardEntry.super_InCatalogEntry.
                 super_CatalogEntry.internal);
  DataChunk::SetValue(pDVar7,0xf,iVar12,&VStack_2c8);
  Value::~Value(&VStack_2c8);
  lVar15 = NumericCastImpl<long,_unsigned_long,_false>::Convert
                     ((pAVar8->super_FunctionEntry).super_StandardEntry.super_InCatalogEntry.
                      super_CatalogEntry.oid);
  Value::BIGINT(&VStack_2c8,lVar15);
  DataChunk::SetValue(pDVar7,0x10,iVar12,&VStack_2c8);
  Value::~Value(&VStack_2c8);
  LogicalType::LogicalType((LogicalType *)&local_288,VARCHAR);
  ToValueVector(&local_130,(duckdb *)local_1b8,
                (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                 *)pbStack_1b0);
  Value::LIST(&VStack_2c8,(LogicalType *)&local_288,&local_130);
  DataChunk::SetValue(pDVar7,0x11,iVar12,&VStack_2c8);
  Value::~Value(&VStack_2c8);
  ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector
            ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_130);
  LogicalType::~LogicalType((LogicalType *)&local_288);
  AggregateFunctionExtractor::ResultType(&VStack_2c8,pAVar8,offset);
  DataChunk::SetValue(pDVar7,0x12,iVar12,&VStack_2c8);
  Value::~Value(&VStack_2c8);
  LogicalType::LogicalType((LogicalType *)&local_288,VARCHAR);
  ToValueVector(&local_148,(duckdb *)pbStack_1a0,
                (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                 *)local_198);
  Value::LIST(&VStack_2c8,(LogicalType *)&local_288,&local_148);
  DataChunk::SetValue(pDVar7,0x13,iVar12,&VStack_2c8);
  Value::~Value(&VStack_2c8);
  ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector
            ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_148);
  LogicalType::~LogicalType((LogicalType *)&local_288);
  pAVar3 = (pAVar8->functions).super_FunctionSet<duckdb::AggregateFunction>.functions.
           super_vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>.
           super__Vector_base<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pAVar4 = *(pointer *)
            ((long)&(pAVar8->functions).super_FunctionSet<duckdb::AggregateFunction>.functions.
                    super_vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>
                    .
                    super__Vector_base<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>
                    ._M_impl + 8);
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&pbStack_1a0);
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_1b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_p != &local_1c8) {
    operator_delete(local_1d8._M_p);
  }
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&vStack_1f0);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)local_208);
  Value::~Value(&local_70);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_e8);
  return offset + 1 == ((long)pAVar4 - (long)pAVar3 >> 4) * -0x79435e50d79435e5;
}

Assistant:

bool ExtractFunctionData(FunctionEntry &entry, idx_t function_idx, DataChunk &output, idx_t output_offset) {
	auto &function = entry.Cast<T>();
	vector<LogicalType> parameter_types_vector = OP::GetParameterLogicalTypes(function, function_idx);
	Value parameter_types_value = OP::GetParameterTypes(function, function_idx);
	optional_idx description_idx = GetFunctionDescriptionIndex(entry.descriptions, parameter_types_vector);
	FunctionDescription function_description =
	    description_idx.IsValid() ? entry.descriptions[description_idx.GetIndex()] : FunctionDescription();

	idx_t col = 0;

	// database_name, LogicalType::VARCHAR
	output.SetValue(col++, output_offset, Value(function.schema.catalog.GetName()));

	// database_oid, BIGINT
	output.SetValue(col++, output_offset, Value::BIGINT(NumericCast<int64_t>(function.schema.catalog.GetOid())));

	// schema_name, LogicalType::VARCHAR
	output.SetValue(col++, output_offset, Value(function.schema.name));

	// function_name, LogicalType::VARCHAR
	output.SetValue(col++, output_offset, Value(function.name));

	// alias_of, LogicalType::VARCHAR
	output.SetValue(col++, output_offset,
	                function.alias_of.empty() || function.alias_of == function.name ? Value()
	                                                                                : Value(function.alias_of));

	// function_type, LogicalType::VARCHAR
	output.SetValue(col++, output_offset, Value(OP::GetFunctionType()));

	// function_description, LogicalType::VARCHAR
	output.SetValue(col++, output_offset,
	                (function_description.description.empty()) ? Value() : Value(function_description.description));

	// comment, LogicalType::VARCHAR
	output.SetValue(col++, output_offset, entry.comment);

	// tags, LogicalType::MAP(LogicalType::VARCHAR, LogicalType::VARCHAR)
	output.SetValue(col++, output_offset, Value::MAP(entry.tags));

	// return_type, LogicalType::VARCHAR
	output.SetValue(col++, output_offset, OP::GetReturnType(function, function_idx));

	// parameters, LogicalType::LIST(LogicalType::VARCHAR)
	output.SetValue(col++, output_offset,
	                GetParameterNames<T, OP>(function, function_idx, function_description, parameter_types_value));

	// parameter_types, LogicalType::LIST(LogicalType::VARCHAR)
	output.SetValue(col++, output_offset, parameter_types_value);

	// varargs, LogicalType::VARCHAR
	output.SetValue(col++, output_offset, OP::GetVarArgs(function, function_idx));

	// macro_definition, LogicalType::VARCHAR
	output.SetValue(col++, output_offset, OP::GetMacroDefinition(function, function_idx));

	// has_side_effects, LogicalType::BOOLEAN
	output.SetValue(col++, output_offset, OP::IsVolatile(function, function_idx));

	// internal, LogicalType::BOOLEAN
	output.SetValue(col++, output_offset, Value::BOOLEAN(function.internal));

	// function_oid, LogicalType::BIGINT
	output.SetValue(col++, output_offset, Value::BIGINT(NumericCast<int64_t>(function.oid)));

	// examples, LogicalType::LIST(LogicalType::VARCHAR)
	output.SetValue(col++, output_offset,
	                Value::LIST(LogicalType::VARCHAR, ToValueVector(function_description.examples)));

	// stability, LogicalType::VARCHAR
	output.SetValue(col++, output_offset, OP::ResultType(function, function_idx));

	// categories, LogicalType::LIST(LogicalType::VARCHAR)
	output.SetValue(col++, output_offset,
	                Value::LIST(LogicalType::VARCHAR, ToValueVector(function_description.categories)));

	return function_idx + 1 == OP::FunctionCount(function);
}